

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

value * __thiscall cppcms::json::value::at(value *this,char *cpath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *this_00;
  iterator iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bad_value_cast *pbVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  ulong uVar12;
  string_key path;
  string local_f8;
  char *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  char *local_c8;
  long local_c0;
  char local_b8 [16];
  key_type local_a8;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(cpath + -1);
  do {
    pcVar2 = local_d0->_M_local_buf + 1;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_d0->_M_local_buf + 1);
  } while (*pcVar2 != '\0');
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = '\0';
  paVar1 = &local_a8.key_.field_2;
  uVar9 = 0;
  local_d8 = cpath;
  do {
    pcVar2 = local_d8;
    local_a8.end_ = (char *)local_d0;
    if (local_d8 == (char *)0x0) {
      pcVar2 = local_c8;
      local_a8.end_ = (char *)(local_c8 + local_c0);
    }
    uVar12 = (long)local_a8.end_ - (long)pcVar2;
    uVar7 = 0xffffffffffffffff;
    uVar8 = uVar9;
    if (uVar9 < uVar12) {
      do {
        uVar7 = uVar8;
        if (pcVar2[uVar8] == '.') break;
        uVar7 = uVar8 + 1;
        uVar8 = uVar7;
      } while (uVar7 <= uVar12);
      if (uVar12 <= uVar7) {
        uVar7 = 0xffffffffffffffff;
      }
    }
    if (uVar9 < uVar12) {
      local_a8.begin_ = pcVar2 + uVar9;
      if (uVar7 - uVar9 <= (ulong)((long)local_a8.end_ - (long)local_a8.begin_)) {
        local_a8.end_ = pcVar2 + uVar7;
      }
    }
    else {
      local_a8.begin_ = (char *)0x0;
      local_a8.end_ = (char *)0x0;
    }
    local_a8.key_._M_string_length = 0;
    local_a8.key_.field_2._M_local_buf[0] = '\0';
    uVar9 = uVar7 + 1;
    if (uVar9 == 0) {
      uVar9 = 0xffffffffffffffff;
    }
    paVar4 = paVar1;
    paVar10 = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.begin_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a8.begin_;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8.end_;
    }
    local_a8.key_._M_dataplus._M_p = (pointer)paVar1;
    if (paVar10 == paVar4) {
      pbVar5 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"Invalid path provided","");
      bad_value_cast::bad_value_cast(pbVar5,&local_f8);
      __cxa_throw(pbVar5,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    if ((*(variant **)this)->type != is_object) {
      pbVar5 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
      bad_value_cast::bad_value_cast
                (pbVar5,&local_f8,*(json_type *)&(*(_Base_ptr *)this)[1]._M_left,is_object);
      __cxa_throw(pbVar5,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    this_00 = &variant::
               get<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                         (*(variant **)this)->_M_t;
    iVar3 = std::
            _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            ::find(this_00,&local_a8);
    if ((_Rb_tree_header *)iVar3._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
      pbVar5 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      string_key::str_abi_cxx11_(&local_70,&local_a8);
      std::operator+(&local_50,"Member ",&local_70);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_f8._M_dataplus._M_p = (pointer)*plVar6;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_f8._M_dataplus._M_p == psVar11) {
        local_f8.field_2._M_allocated_capacity = *psVar11;
        local_f8.field_2._8_8_ = plVar6[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar11;
      }
      local_f8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      bad_value_cast::bad_value_cast(pbVar5,&local_f8);
      __cxa_throw(pbVar5,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.key_._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8.key_._M_dataplus._M_p);
    }
    paVar4 = local_d0;
    pcVar2 = local_d8;
    if (local_d8 == (char *)0x0) {
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_c8 + local_c0);
      pcVar2 = local_c8;
    }
    this = (value *)&iVar3._M_node[2]._M_left;
    if ((ulong)((long)paVar4 - (long)pcVar2) <= uVar9) {
      if (local_c8 != local_b8) {
        operator_delete(local_c8);
      }
      return (value *)(_Base_ptr *)this;
    }
  } while( true );
}

Assistant:

value &value::at(char const *cpath)
	{
		string_key path=string_key::unowned(cpath);
		value *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key part=path.unowned_substr(pos,new_pos - pos);
			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				throw bad_value_cast("Invalid path provided");
			if(ptr->type()!=json::is_object)
				throw bad_value_cast("",ptr->type(),json::is_object);
			json::object &obj=ptr->object();
			json::object::iterator p;
			if((p=obj.find(part))==obj.end())
				throw bad_value_cast("Member "+part.str()+" not found");
			ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		return *ptr;
	}